

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O0

QByteArray * __thiscall QHttpNetworkReply::readAny(QHttpNetworkReply *this)

{
  bool bVar1;
  QHttpNetworkReplyPrivate *pQVar2;
  qsizetype qVar3;
  size_t in_RCX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *__buf;
  QHttpNetworkConnectionPrivate *in_RSI;
  QByteDataBuffer *in_RDI;
  QHttpNetworkReplyPrivate *d;
  QByteDataBuffer *reply;
  
  reply = in_RDI;
  pQVar2 = d_func((QHttpNetworkReply *)0x3046ae);
  qVar3 = QByteDataBuffer::bufferCount((QByteDataBuffer *)0x3046c4);
  if (qVar3 == 0) {
    QByteArray::QByteArray((QByteArray *)0x3046d4);
  }
  else {
    __buf = extraout_RDX;
    if ((pQVar2->downstreamLimited & 1U) != 0) {
      qVar3 = QByteDataBuffer::bufferCount((QByteDataBuffer *)0x3046f5);
      __buf = extraout_RDX_00;
      if (qVar3 == 1) {
        bVar1 = isFinished((QHttpNetworkReply *)0x304705);
        __buf = extraout_RDX_01;
        if (!bVar1) {
          QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x30471a)
          ;
          QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x304722);
          QHttpNetworkConnectionPrivate::readMoreLater(in_RSI,(QHttpNetworkReply *)reply);
          __buf = extraout_RDX_02;
        }
      }
    }
    QByteDataBuffer::read(in_RDI,(int)pQVar2 + 400,__buf,in_RCX);
  }
  return (QByteArray *)reply;
}

Assistant:

QByteArray QHttpNetworkReply::readAny()
{
    Q_D(QHttpNetworkReply);
    if (d->responseData.bufferCount() == 0)
        return QByteArray();

    // we'll take the last buffer, so schedule another read from http
    if (d->downstreamLimited && d->responseData.bufferCount() == 1 && !isFinished())
        d->connection->d_func()->readMoreLater(this);
    return d->responseData.read();
}